

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O0

void pzshape::TPZShapeDisc::Legendre
               (REAL C,REAL x0,REAL x,int degree,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,
               int n)

{
  double *pdVar1;
  int in_ECX;
  TPZFMatrix<double> *in_RDX;
  long *in_RSI;
  int in_EDI;
  __type_conflict _Var2;
  int ideriv;
  int ord;
  REAL val;
  int in_stack_ffffffffffffffac;
  int local_48;
  int local_44;
  double in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  
  (**(code **)(*in_RSI + 0x70))(in_RSI,(long)(in_EDI + 1),1);
  (*(in_RDX->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (in_RDX,(long)in_ECX,(long)(in_EDI + 1));
  TPZShapeLinear::Legendre(x,degree,phi,dphi,n);
  for (local_44 = 0; local_44 < in_EDI + 1; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < in_ECX; local_48 = local_48 + 1) {
      pdVar1 = TPZFMatrix<double>::operator()
                         (in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffc8),
                          (int64_t)in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffc0 = *pdVar1;
      _Var2 = std::pow<double,int>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffac);
      in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 / _Var2;
      (*(in_RDX->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x20])(in_RDX,(long)local_48,(long)local_44,&stack0xffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void TPZShapeDisc::Legendre(REAL C,REAL x0,REAL x,int degree,TPZFMatrix<REAL> & phi,TPZFMatrix<REAL> & dphi, int n){
#ifdef PZDEBUG
  if(IsZero(C)){
    DebugStop();
  }
#endif

   x = (x - x0) / C;
   phi.Redim(degree+1,1);
   dphi.Redim(n,degree+1);

   TPZShapeLinear::Legendre(x, degree+1, phi, dphi, n);

   REAL val;
   for(int ord = 0; ord < degree+1; ord++)
      for (int ideriv = 0; ideriv < n; ideriv++){
	 val = dphi(ideriv, ord) / pow(C, ideriv+1);
	 dphi.Put(ideriv, ord, val);
      }

}